

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::findAndNotifyEndpointTargets
          (CoreBroker *this,BasicHandleInfo *handleInfo,string *key)

{
  UnknownHandleManager *this_00;
  pointer pbVar1;
  BasicHandleInfo *pBVar2;
  uint uVar3;
  pair<helics::action_message_def::action_t,_helics::action_message_def::action_t> actions;
  pair<helics::action_message_def::action_t,_helics::action_message_def::action_t> actions_00;
  pair<helics::GlobalHandle,_unsigned_short> *target;
  pointer ppVar4;
  pointer pbVar5;
  pair<helics::GlobalHandle,_unsigned_short> *target_1;
  pointer ppVar6;
  string_view name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  eptTargets;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  uHandles;
  ActionMessage link;
  
  this_00 = &this->unknownHandles;
  UnknownHandleManager::checkForEndpoints
            ((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
              *)&uHandles,this_00,(string *)key);
  ppVar6 = uHandles.
           super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = uHandles.
                super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar6; ppVar4 = ppVar4 + 1) {
    pBVar2 = HandleManager::findHandle(&this->handles,ppVar4->first);
    uVar3 = (uint)ppVar4->second;
    actions.first = cmd_add_endpoint;
    actions.second = cmd_add_filter;
    if (pBVar2->handleType != FILTER) {
      uVar3 = uVar3 ^ 2;
      actions.first = cmd_add_endpoint;
      actions.second = cmd_add_endpoint;
    }
    connectInterfaces(this,handleInfo,(uint)ppVar4->second,pBVar2,uVar3,actions);
  }
  UnknownHandleManager::checkForEndpointLinks(&eptTargets,this_00,(string *)key);
  pbVar1 = eptTargets.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = eptTargets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    ActionMessage::ActionMessage(&link,cmd_add_named_endpoint);
    name._M_str = (pbVar5->_M_dataplus)._M_p;
    name._M_len = pbVar5->_M_string_length;
    ActionMessage::name(&link,name);
    link._8_8_ = handleInfo->handle;
    link.flags._0_1_ = (byte)link.flags | 2;
    link.counter = 0x65;
    checkForNamedInterface(this,&link);
    ActionMessage::~ActionMessage(&link);
  }
  if ((uHandles.
       super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       uHandles.
       super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (eptTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      eptTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    UnknownHandleManager::clearEndpoint(this_00,(string *)key);
  }
  if ((this->super_BrokerBase).brokerState._M_i == OPERATING) {
    UnknownHandleManager::checkForReconnectionEndpoints
              ((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                *)&link,this_00,(string *)key);
    CLI::std::
    vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::_M_move_assign(&uHandles,&link);
    CLI::std::
    _Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::~_Vector_base((_Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                     *)&link);
    for (ppVar6 = uHandles.
                  super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar6 != uHandles.
                  super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar6 = ppVar6 + 1) {
      pBVar2 = HandleManager::findHandle(&this->handles,ppVar6->first);
      uVar3 = (uint)ppVar6->second;
      actions_00.first = cmd_add_endpoint;
      actions_00.second = cmd_add_filter;
      if (pBVar2->handleType != FILTER) {
        uVar3 = uVar3 ^ 2;
        actions_00.first = cmd_add_endpoint;
        actions_00.second = cmd_add_endpoint;
      }
      connectInterfaces(this,handleInfo,(uint)ppVar6->second,pBVar2,uVar3,actions_00);
    }
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&eptTargets);
  CLI::std::
  _Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  ::~_Vector_base(&uHandles.
                   super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                 );
  return;
}

Assistant:

void CoreBroker::findAndNotifyEndpointTargets(BasicHandleInfo& handleInfo, const std::string& key)
{
    auto uHandles = unknownHandles.checkForEndpoints(key);
    for (const auto& target : uHandles) {
        const auto* iface = handles.findHandle(target.first);
        auto destFlags = target.second;
        if (iface->handleType != InterfaceType::FILTER) {
            destFlags = toggle_flag(destFlags, destination_target);
        }

        connectInterfaces(handleInfo,
                          target.second,
                          *iface,

                          destFlags,
                          std::make_pair(CMD_ADD_ENDPOINT,
                                         (iface->handleType != InterfaceType::FILTER) ?
                                             CMD_ADD_ENDPOINT :
                                             CMD_ADD_FILTER));
    }

    auto eptTargets = unknownHandles.checkForEndpointLinks(key);
    for (const auto& ept : eptTargets) {
        ActionMessage link(CMD_ADD_NAMED_ENDPOINT);
        link.name(ept);
        link.setSource(handleInfo.handle);
        setActionFlag(link, destination_target);
        link.counter = static_cast<uint16_t>(InterfaceType::ENDPOINT);
        checkForNamedInterface(link);
    }

    if (!(uHandles.empty() && eptTargets.empty())) {
        unknownHandles.clearEndpoint(key);
    }

    if (getBrokerState() == BrokerState::OPERATING) {
        uHandles = unknownHandles.checkForReconnectionEndpoints(key);
        for (const auto& target : uHandles) {
            const auto* iface = handles.findHandle(target.first);
            auto destFlags = target.second;
            if (iface->handleType != InterfaceType::FILTER) {
                destFlags = toggle_flag(destFlags, destination_target);
            }

            connectInterfaces(handleInfo,
                              target.second,
                              *iface,

                              destFlags,
                              std::make_pair(CMD_ADD_ENDPOINT,
                                             (iface->handleType != InterfaceType::FILTER) ?
                                                 CMD_ADD_ENDPOINT :
                                                 CMD_ADD_FILTER));
        }
    }
}